

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O0

void helper_retry_sparc64(CPUSPARCState_conflict2 *env)

{
  int iVar1;
  uint new_gl_00;
  trap_state *ptVar2;
  uint32_t new_gl;
  trap_state *tsptr;
  CPUSPARCState_conflict2 *env_local;
  
  ptVar2 = cpu_tsptr_sparc64((CPUSPARCState_conflict1 *)env);
  env->pc = ptVar2->tpc;
  env->npc = ptVar2->tnpc;
  cpu_put_ccr_sparc64(env,ptVar2->tstate >> 0x20);
  env->asi = (uint)(ptVar2->tstate >> 0x18) & 0xff;
  cpu_change_pstate_sparc64(env,(uint)(ptVar2->tstate >> 8) & 0xf3f);
  cpu_put_cwp64_sparc64(env,(uint)ptVar2->tstate & 0xff);
  iVar1 = cpu_has_hypervisor(env);
  if (iVar1 != 0) {
    new_gl_00 = (uint)(ptVar2->tstate >> 0x28) & 7;
    env->hpstate = env->htstate[env->tl];
    cpu_gl_switch_gregs_sparc64(env,new_gl_00);
    env->gl = new_gl_00;
  }
  env->tl = env->tl - 1;
  cpu_interrupts_enabled(env);
  return;
}

Assistant:

void helper_retry(CPUSPARCState *env)
{
    trap_state *tsptr = cpu_tsptr(env);

    env->pc = tsptr->tpc;
    env->npc = tsptr->tnpc;
    cpu_put_ccr(env, tsptr->tstate >> 32);
    env->asi = (tsptr->tstate >> 24) & 0xff;
    cpu_change_pstate(env, (tsptr->tstate >> 8) & 0xf3f);
    cpu_put_cwp64(env, tsptr->tstate & 0xff);
    if (cpu_has_hypervisor(env)) {
        uint32_t new_gl = (tsptr->tstate >> 40) & 7;
        env->hpstate = env->htstate[env->tl];
        cpu_gl_switch_gregs(env, new_gl);
        env->gl = new_gl;
    }
    env->tl--;

    if (cpu_interrupts_enabled(env)) {
        // cpu_check_irqs(env);
    }
}